

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint crnlib::etc1_decode_value(uint diff,uint inten,uint selector,uint packed_c)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  int c;
  uint local_14;
  
  if (in_EDI == 0) {
    local_14 = in_ECX | in_ECX << 4;
  }
  else {
    local_14 = in_ECX >> 2 | in_ECX << 3;
  }
  uVar1 = math::clamp<int>(*(int *)(g_etc1_inten_tables + (ulong)in_EDX * 4 + (ulong)in_ESI * 0x10)
                           + local_14,0,0xff);
  return uVar1;
}

Assistant:

static uint etc1_decode_value(uint diff, uint inten, uint selector, uint packed_c) {
  CRNLIB_ASSERT((diff < 2) && (inten < 8) && (selector < 4) && (packed_c < (diff ? 32 : 16)));
  int c;
  if (diff)
    c = (packed_c >> 2) | (packed_c << 3);
  else
    c = packed_c | (packed_c << 4);
  c += g_etc1_inten_tables[inten][selector];
  c = math::clamp<int>(c, 0, 255);
  return c;
}